

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
kaitai::kstruct_error::kstruct_error(kstruct_error *this,string *what,string *src_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,src_path,": ");
  std::operator+(&local_60,&local_40,what);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__kstruct_error_00280a18;
  std::__cxx11::string::string((string *)&this->m_src_path,(string *)src_path);
  return;
}

Assistant:

kstruct_error(const std::string what, const std::string src_path):
        std::runtime_error(src_path + ": " + what),
        m_src_path(src_path)
    {
    }